

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnSelectExpr(BinaryReaderIR *this,Type result_type)

{
  initializer_list<wabt::Type> __l;
  allocator<wabt::Type> local_55;
  Type local_54;
  iterator local_50;
  size_type local_48;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_40;
  unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_> local_28;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  BinaryReaderIR *local_18;
  BinaryReaderIR *this_local;
  Type result_type_local;
  
  local_50 = &local_54;
  local_48 = 1;
  local_54.enum_ = result_type.enum_;
  local_18 = this;
  this_local._0_4_ = result_type.enum_;
  std::allocator<wabt::Type>::allocator(&local_55);
  __l._M_len = local_48;
  __l._M_array = local_50;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_40,__l,&local_55);
  MakeUnique<wabt::SelectExpr,std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((wabt *)&local_28,&local_40);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::SelectExpr,std::default_delete<wabt::SelectExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_20,&local_28);
  this_local._4_4_ = AppendExpr(this,&local_20);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_20);
  std::unique_ptr<wabt::SelectExpr,_std::default_delete<wabt::SelectExpr>_>::~unique_ptr(&local_28);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_40);
  std::allocator<wabt::Type>::~allocator(&local_55);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnSelectExpr(Type result_type) {
  return AppendExpr(MakeUnique<SelectExpr>(TypeVector{result_type}));
}